

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergefiles.c
# Opt level: O0

econf_err merge_econf_files(econf_file **key_files,econf_file **merged_files)

{
  econf_file *key_file;
  int iVar1;
  econf_err eVar2;
  char *__s1;
  char *__s2;
  char *compare_file;
  char *current_file;
  econf_file **double_key_files;
  econf_file *tmp;
  econf_err error;
  econf_file **merged_files_local;
  econf_file **key_files_local;
  
  if ((*key_files == (econf_file *)0x0) || (merged_files == (econf_file **)0x0)) {
    key_files_local._4_4_ = ECONF_ERROR;
  }
  else {
    merged_files_local = key_files + 1;
    *merged_files = *key_files;
    if (*merged_files == (econf_file *)0x0) {
      key_files_local._4_4_ = ECONF_ERROR;
    }
    else {
      for (; *merged_files_local != (econf_file *)0x0; merged_files_local = merged_files_local + 1)
      {
        key_file = *merged_files;
        __s1 = __xpg_basename((*merged_files_local)->path);
        current_file = (char *)merged_files_local;
        do {
          current_file = (char *)((long)current_file + 8);
          if (*(long *)current_file == 0) break;
          __s2 = __xpg_basename(*(char **)(*(long *)current_file + 0x20));
          iVar1 = strcmp(__s1,__s2);
        } while (iVar1 != 0);
        if (*(long *)current_file == 0) {
          eVar2 = econf_mergeFiles(merged_files,*merged_files,*merged_files_local);
          if (eVar2 != ECONF_SUCCESS) {
            return eVar2;
          }
          if (*merged_files == (econf_file *)0x0) {
            return ECONF_SUCCESS;
          }
          (*merged_files)->on_merge_delete = true;
          if ((key_file->on_merge_delete & 1U) != 0) {
            econf_freeFile(key_file);
          }
        }
        if (((*merged_files_local)->on_merge_delete & 1U) != 0) {
          econf_freeFile(*merged_files_local);
        }
      }
      key_files_local._4_4_ = ECONF_SUCCESS;
    }
  }
  return key_files_local._4_4_;
}

Assistant:

econf_err merge_econf_files(econf_file **key_files, econf_file **merged_files) {
  if (*key_files == NULL || merged_files == NULL)
    return ECONF_ERROR;

  *merged_files = *key_files++;
  if(*merged_files == NULL)
    return ECONF_ERROR;

  while(*key_files) {
    econf_err error;
    econf_file *tmp = *merged_files;
    econf_file **double_key_files = key_files+1;
    char * current_file = basename((*key_files)->path);

    /* key_files are already sorted. If there is a file with the same name with
       a higher priority, the current file will be ignored.
       e.g. /usr/etc/shells.d/tcsh will not be merged if /etc/shells.d/tcsh exists.
    */
    while (*double_key_files) {
      char * compare_file = basename((*double_key_files)->path);
      if (strcmp(current_file, compare_file) == 0) {
	break;
      }
      double_key_files++;
    }

    if (*double_key_files == NULL) {
      error = econf_mergeFiles(merged_files, *merged_files, *key_files);
      if (error || *merged_files == NULL)
        return error;
      (*merged_files)->on_merge_delete = 1;
      if(tmp->on_merge_delete) { econf_free(tmp); }
    }

    if((*key_files)->on_merge_delete) { econf_free(*key_files); }

    key_files++;
  }

  return ECONF_SUCCESS;
}